

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat32 *
fetchARGBPMToRGBA32F<(QImage::Format)6>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  ulong uVar1;
  ulong uVar2;
  QRgbaFloat<float> QVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)count;
  if (count < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 * 4 != uVar2; uVar2 = uVar2 + 4) {
    QVar3 = QRgbaFloat<float>::fromArgb32(*(uint *)(src + uVar2 + (long)index * 4));
    *(QRgbaFloat<float> *)(&buffer->r + uVar2) = QVar3;
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBPMToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                        const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i));
    return buffer;
}